

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O3

void __thiscall
ghc::filesystem::path::path<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
          (path *this,
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          first,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                last,format fmt)

{
  ulong uVar1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var2;
  undefined4 in_register_0000000c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  ulong local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  local_40 = &local_30;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((string *)&local_40,first._M_current,last._M_current,CONCAT44(in_register_0000000c,fmt)
            );
  uVar1 = local_38;
  paVar3 = &(this->_path).field_2;
  (this->_path)._M_dataplus._M_p = (pointer)paVar3;
  if (local_40 == &local_30) {
    *(undefined4 *)paVar3 = local_30._M_allocated_capacity._0_4_;
    *(undefined4 *)((long)&(this->_path).field_2 + 4) = local_30._M_allocated_capacity._4_4_;
    *(undefined4 *)((long)&(this->_path).field_2 + 8) = local_30._8_4_;
    *(undefined4 *)((long)&(this->_path).field_2 + 0xc) = local_30._12_4_;
  }
  else {
    (this->_path)._M_dataplus._M_p = (pointer)local_40;
    (this->_path).field_2._M_allocated_capacity =
         CONCAT44(local_30._M_allocated_capacity._4_4_,local_30._M_allocated_capacity._0_4_);
    paVar3 = local_40;
  }
  (this->_path)._M_string_length = local_38;
  local_38 = 0;
  local_30._M_allocated_capacity._0_4_ = local_30._M_allocated_capacity._0_4_ & 0xffffff00;
  if ((((uVar1 < 3) || (paVar3->_M_local_buf[0] != '/')) || (paVar3->_M_local_buf[1] != '/')) ||
     (paVar3->_M_local_buf[2] == '/')) {
    local_40 = &local_30;
    _Var2 = std::
            __unique<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_comp_iter<ghc::filesystem::path::postprocess_path_with_format(ghc::filesystem::path::format)::_lambda(char,char)_2_>>
                      (paVar3,(char *)(uVar1 + (long)paVar3));
  }
  else {
    local_40 = &local_30;
    _Var2 = std::
            __unique<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_comp_iter<ghc::filesystem::path::postprocess_path_with_format(ghc::filesystem::path::format)::_lambda(char,char)_1_>>
                      ((char *)((long)paVar3 + 2),(char *)(uVar1 + (long)paVar3));
  }
  (this->_path)._M_string_length = (long)_Var2._M_current - (long)(this->_path)._M_dataplus._M_p;
  *_Var2._M_current = '\0';
  if (local_40 != &local_30) {
    operator_delete(local_40);
  }
  return;
}

Assistant:

inline path::path(InputIterator first, InputIterator last, format fmt)
    : path(std::basic_string<typename std::iterator_traits<InputIterator>::value_type>(first, last), fmt)
{
    // delegated
}